

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void AMPLS__internal__Close(AMPLS_MP_Solver *slv)

{
  AMPLS_MP__internal_T *this;
  
  this = (AMPLS_MP__internal_T *)slv->internal_info_;
  if (this != (AMPLS_MP__internal_T *)0x0) {
    AMPLS_MP__internal_T::~AMPLS_MP__internal_T(this);
  }
  operator_delete(this,0xb8);
  operator_delete(slv,0x18);
  return;
}

Assistant:

void AMPLS__internal__Close(AMPLS_MP_Solver* slv) {
  assert(slv->internal_info_);
  delete (AMPLS_MP__internal*)slv->internal_info_;
  delete slv;
}